

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportInstallAndroidMKGenerator.cxx
# Opt level: O1

void __thiscall
cmExportInstallAndroidMKGenerator::GenerateImportTargetCode
          (cmExportInstallAndroidMKGenerator *this,ostream *os,cmGeneratorTarget *target,
          TargetType param_3)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmTarget *this_00;
  ostream *poVar2;
  string *psVar3;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  string config;
  string targetName;
  string local_a0;
  string local_80;
  char *local_60;
  string *local_58;
  string local_50;
  
  cmGeneratorTarget::GetExportName_abi_cxx11_(&local_a0,target);
  local_80._M_string_length =
       (size_type)
       (this->super_cmExportInstallFileGenerator).super_cmExportFileGenerator.Namespace._M_dataplus.
       _M_p;
  local_80._M_dataplus._M_p =
       (pointer)(this->super_cmExportInstallFileGenerator).super_cmExportFileGenerator.Namespace.
                _M_string_length;
  local_80.field_2._M_allocated_capacity = 0;
  local_80.field_2._8_8_ = local_a0._M_string_length;
  local_60 = local_a0._M_dataplus._M_p;
  views._M_len = 2;
  views._M_array = (iterator)&local_80;
  local_58 = &local_a0;
  cmCatViews(&local_50,views);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"include $(CLEAR_VARS)\n",0x16);
  std::__ostream_insert<char,std::char_traits<char>>(os,"LOCAL_MODULE := ",0x10);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (os,local_50._M_dataplus._M_p,local_50._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (os,"LOCAL_SRC_FILES := $(_IMPORT_PREFIX)/",0x25);
  this_00 = target->Target;
  paVar1 = &local_80.field_2;
  local_80._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"__dest","");
  psVar3 = cmTarget::GetSafeProperty(this_00,&local_80);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (os,(psVar3->_M_dataplus)._M_p,psVar3->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"/",1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != paVar1) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  local_80._M_string_length = 0;
  local_80.field_2._M_allocated_capacity =
       local_80.field_2._M_allocated_capacity & 0xffffffffffffff00;
  local_80._M_dataplus._M_p = (pointer)paVar1;
  if ((this->super_cmExportInstallFileGenerator).super_cmExportFileGenerator.Configurations.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (this->super_cmExportInstallFileGenerator).super_cmExportFileGenerator.Configurations.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::__cxx11::string::_M_assign((string *)&local_80);
  }
  cmGeneratorTarget::GetFullName(&local_a0,target,&local_80,RuntimeBinaryArtifact);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (os,local_a0._M_dataplus._M_p,local_a0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != paVar1) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmExportInstallAndroidMKGenerator::GenerateImportTargetCode(
  std::ostream& os, cmGeneratorTarget const* target,
  cmStateEnums::TargetType /*targetType*/)
{
  std::string targetName = cmStrCat(this->Namespace, target->GetExportName());
  os << "include $(CLEAR_VARS)\n";
  os << "LOCAL_MODULE := ";
  os << targetName << "\n";
  os << "LOCAL_SRC_FILES := $(_IMPORT_PREFIX)/";
  os << target->Target->GetSafeProperty("__dest") << "/";
  std::string config;
  if (!this->Configurations.empty()) {
    config = this->Configurations[0];
  }
  os << target->GetFullName(config) << "\n";
}